

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::print(JSPrinter *this,Ref node)

{
  ulong uVar1;
  Ref *pRVar2;
  char *pcVar3;
  size_t *psVar4;
  JSPrinter *this_00;
  JSPrinter *this_01;
  Ref local_18;
  Ref node_local;
  ulong uVar5;
  
  local_18.inst = node.inst;
  ensure(this,100);
  switch((local_18.inst)->type) {
  case String:
    printName(this,local_18);
    return;
  case Number:
    printNum(this,local_18);
    return;
  case Assign_:
    printAssign(this,local_18);
    return;
  case AssignName_:
    printAssignName(this,local_18);
    return;
  }
  psVar4 = (size_t *)0x0;
  pRVar2 = Ref::operator[](&local_18,0);
  if (pRVar2->inst->type != String) {
    __assert_fail("isString()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0xf0,"IString &cashew::Value::getIString()");
  }
  this_00 = (JSPrinter *)(pRVar2->inst->field_1).str.str._M_str;
  switch(this_00->pretty) {
  case true:
    if (this_00 != DAT_00dbe140) {
LAB_005e748b:
      abort();
    }
    printArray(this,local_18);
    break;
  case true:
    if (this_00 == DAT_00dbdcb0) {
      printBinary(this,local_18);
    }
    else if (this_00 == DAT_00dbdc70) {
      printBlock(this,local_18);
    }
    else {
      if (this_00 != DAT_00dbdd60) goto LAB_005e748b;
      printBreak(this,local_18);
    }
    break;
  case true:
    if (this_00 == DAT_00dbdd40) {
      printCall(this,local_18);
    }
    else if (this_00 == DAT_00dbdca0) {
      printConditional(this,local_18);
    }
    else {
      if (this_00 != DAT_00dbdd70) goto LAB_005e748b;
      printContinue(this,local_18);
    }
    break;
  case true:
    if (this_00 == DAT_00dbdc60) {
      printDefun(this,local_18);
    }
    else if (this_00 == DAT_00dbdd00) {
      printDo(this,local_18);
    }
    else {
      if (this_00 != DAT_00dbe110) goto LAB_005e748b;
      printDot(this,local_18);
    }
    break;
  default:
    print(this_00);
    if (this_00->size < this_00->used + (long)(int)psVar4) {
      uVar1 = this_00->size * 2;
      uVar5 = 0x400;
      if (0x400 < uVar1) {
        uVar5 = uVar1;
      }
      this_01 = (JSPrinter *)(uVar5 + (long)(int)psVar4);
      this_00->size = (size_t)this_01;
      if (this_00->buffer == (char *)0x0) {
        pcVar3 = (char *)malloc((size_t)this_01);
        this_00->buffer = pcVar3;
        if (pcVar3 == (char *)0x0) goto LAB_005e751a;
      }
      else {
        pcVar3 = (char *)realloc(this_00->buffer,(size_t)this_01);
        if (pcVar3 == (char *)0x0) {
          psVar4 = &this_00->size;
          ensure();
LAB_005e751a:
          ensure(this_01);
          if ((int)*psVar4 == 0) {
            emit(this_01,(char *)psVar4[2]);
            return;
          }
          __assert_fail("isString()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                        ,0xec,"const char *cashew::Value::getCString()");
        }
        this_00->buffer = pcVar3;
      }
    }
    return;
  case true:
    if (this_00 != DAT_00dbdcd0) goto LAB_005e748b;
    printIf(this,local_18);
    break;
  case true:
    if (this_00 != DAT_00dbdd50) goto LAB_005e748b;
    printLabel(this,local_18);
    break;
  case true:
    if (this_00 != DAT_00dbe130) goto LAB_005e748b;
    printNew(this,local_18);
    break;
  case true:
    if (this_00 == DAT_00dbe150) {
      printObject(this,local_18);
    }
    break;
  case true:
    if (this_00 != DAT_00dbdcc0) goto LAB_005e748b;
    printReturn(this,local_18);
    break;
  case true:
    if (this_00 == DAT_00dbdd30) {
      printSub(this,local_18);
    }
    else if (this_00 == DAT_00dbdd20) {
      printSeq(this,local_18);
    }
    else if (this_00 == DAT_00dbdd80) {
      printSwitch(this,local_18);
    }
    else {
      if (this_00 != DAT_00dbdd90) goto LAB_005e748b;
      printString(this,local_18);
    }
    break;
  case true:
    if (this_00 == DAT_00dbdc50) {
      printToplevel(this,local_18);
    }
    else {
      if (this_00 != DAT_00dbdda0) goto LAB_005e748b;
      printTry(this,local_18);
    }
    break;
  case true:
    if (this_00 != DAT_00dbddf0) goto LAB_005e748b;
    printUnaryPrefix(this,local_18);
    break;
  case true:
    if (this_00 != DAT_00dbdc80) goto LAB_005e748b;
    printVar(this,local_18);
    break;
  case true:
    if (this_00 != DAT_00dbdcf0) goto LAB_005e748b;
    printWhile(this,local_18);
  }
  return;
}

Assistant:

void print(Ref node) {
    ensure();
    if (node->isString()) {
      printName(node);
      return;
    }
    if (node->isNumber()) {
      printNum(node);
      return;
    }
    if (node->isAssignName()) {
      printAssignName(node);
      return;
    }
    if (node->isAssign()) {
      printAssign(node);
      return;
    }
    IString type = node[0]->getIString();
    switch (type.str[0]) {
      case 'a': {
        if (type == ARRAY) {
          printArray(node);
        } else {
          abort();
        }
        break;
      }
      case 'b': {
        if (type == BINARY) {
          printBinary(node);
        } else if (type == BLOCK) {
          printBlock(node);
        } else if (type == BREAK) {
          printBreak(node);
        } else {
          abort();
        }
        break;
      }
      case 'c': {
        if (type == CALL) {
          printCall(node);
        } else if (type == CONDITIONAL) {
          printConditional(node);
        } else if (type == CONTINUE) {
          printContinue(node);
        } else {
          abort();
        }
        break;
      }
      case 'd': {
        if (type == DEFUN) {
          printDefun(node);
        } else if (type == DO) {
          printDo(node);
        } else if (type == DOT) {
          printDot(node);
        } else {
          abort();
        }
        break;
      }
      case 'i': {
        if (type == IF) {
          printIf(node);
        } else {
          abort();
        }
        break;
      }
      case 'l': {
        if (type == LABEL) {
          printLabel(node);
        } else {
          abort();
        }
        break;
      }
      case 'n': {
        if (type == NEW) {
          printNew(node);
        } else {
          abort();
        }
        break;
      }
      case 'o': {
        if (type == OBJECT) {
          printObject(node);
        }
        break;
      }
      case 'r': {
        if (type == RETURN) {
          printReturn(node);
        } else {
          abort();
        }
        break;
      }
      case 's': {
        if (type == SUB) {
          printSub(node);
        } else if (type == SEQ) {
          printSeq(node);
        } else if (type == SWITCH) {
          printSwitch(node);
        } else if (type == STRING) {
          printString(node);
        } else {
          abort();
        }
        break;
      }
      case 't': {
        if (type == TOPLEVEL) {
          printToplevel(node);
        } else if (type == TRY) {
          printTry(node);
        } else {
          abort();
        }
        break;
      }
      case 'u': {
        if (type == UNARY_PREFIX) {
          printUnaryPrefix(node);
        } else {
          abort();
        }
        break;
      }
      case 'v': {
        if (type == VAR) {
          printVar(node);
        } else {
          abort();
        }
        break;
      }
      case 'w': {
        if (type == WHILE) {
          printWhile(node);
        } else {
          abort();
        }
        break;
      }
      default: {
        errv("cannot yet print %s\n", type.str.data());
        abort();
      }
    }
  }